

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp_info.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  pointer pMVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  MzpArchiveEntry *header;
  MzpArchiveHeader MVar10;
  ulong uVar11;
  undefined1 local_88 [8];
  Mzp mzp;
  string archive_data;
  
  if (argc == 2) {
    mzp.entry_data.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&archive_data._M_string_length;
    archive_data._M_dataplus._M_p = (pointer)0x0;
    archive_data._M_string_length._0_1_ = 0;
    bVar1 = mg::fs::read_file(argv[1],(string *)
                                      &mzp.entry_data.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar5 = -1;
    if (bVar1) {
      mzp.entry_data.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      mzp.entry_data.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      mzp.entry_headers.
      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      mzp.entry_headers.
      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      mzp.header.magic[0] = '\0';
      mzp.header.magic[1] = '\0';
      mzp.header.magic[2] = '\0';
      mzp.header.magic[3] = '\0';
      mzp.header.magic[4] = '\0';
      mzp.header.magic[5] = '\0';
      mzp.header.archive_entry_count = 0;
      mzp.entry_headers.
      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bVar1 = mg::data::mzp_read((string *)
                                 &mzp.entry_data.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(Mzp *)local_88
                                );
      if (bVar1) {
        iVar5 = 0;
        fprintf(_stderr,"MZP archive of %lu elements:\n",
                (long)mzp.entry_headers.
                      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)mzp.header >> 3);
        pMVar2 = mzp.entry_headers.
                 super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        MVar10 = mzp.header;
        if (mzp.header !=
            (MzpArchiveHeader)
            mzp.entry_headers.
            super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          do {
            mg::data::Mzp::MzpArchiveEntry::print((MzpArchiveEntry *)MVar10);
            MVar10 = (MzpArchiveHeader)((long)MVar10 + 8);
          } while (MVar10 != (MzpArchiveHeader)pMVar2);
          if ((MzpArchiveHeader)
              mzp.entry_headers.
              super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
              ._M_impl.super__Vector_impl_data._M_start != mzp.header) {
            uVar6 = 0;
            MVar10 = mzp.header;
            pMVar2 = mzp.entry_headers.
                     super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar8 = 0;
            do {
              uVar11 = (ulong)uVar6;
              uVar6 = uVar6 + 1;
              uVar9 = (ulong)uVar6;
              uVar4 = (long)pMVar2 - (long)MVar10 >> 3;
              if (uVar9 < uVar4) {
                uVar4 = (ulong)uVar6;
                do {
                  uVar7 = (uint)*(ushort *)((long)MVar10 + 2 + uVar8 * 8) +
                          (uint)*(ushort *)((long)MVar10 + uVar8 * 8) * 0x800;
                  uVar3 = (uint)*(ushort *)((long)MVar10 + 2 + uVar4 * 8) +
                          (uint)*(ushort *)((long)MVar10 + uVar4 * 8) * 0x800;
                  if ((uVar7 <= uVar3) &&
                     (uVar3 <= uVar7 + *(ushort *)((long)MVar10 + 6 + uVar8 * 8) +
                               (*(ushort *)((long)MVar10 + 4 + uVar8 * 8) & 0xffe0) * 0x800)) {
                    fprintf(_stderr,"Entry %u begins inside of entry %u\n",uVar4,uVar11);
                    MVar10 = mzp.header;
                    pMVar2 = mzp.entry_headers.
                             super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  }
                  uVar4 = (ulong)((int)uVar4 + 1);
                } while (uVar4 < (ulong)((long)pMVar2 - (long)MVar10 >> 3));
                uVar4 = (long)pMVar2 - (long)MVar10 >> 3;
              }
              uVar8 = uVar9;
            } while (uVar9 < uVar4);
            iVar5 = 0;
          }
        }
      }
      else {
        main_cold_2();
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&mzp.entry_headers.
                    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (mzp.header != (MzpArchiveHeader)0x0) {
        operator_delete((void *)mzp.header,
                        (long)mzp.entry_headers.
                              super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)mzp.header);
      }
    }
    if (mzp.entry_data.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
        (pointer)&archive_data._M_string_length) {
      operator_delete(mzp.entry_data.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      CONCAT71(archive_data._M_string_length._1_7_,
                               (undefined1)archive_data._M_string_length) + 1);
    }
  }
  else {
    main_cold_1();
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 2) {
    fprintf(stderr, "%s infile\n", argv[0]);
    return -1;
  }

  // Read input file
  std::string archive_data;
  if (!mg::fs::read_file(argv[1], archive_data)) {
    return -1;
  }

  // Extract header
  mg::data::Mzp mzp;
  if (!mg::data::mzp_read(archive_data, mzp)) {
    fprintf(stderr, "Failed to parse archive\n");
    return -1;
  }

  fprintf(stderr, "MZP archive of %lu elements:\n", mzp.entry_headers.size());
  for (auto &header : mzp.entry_headers) {
    header.print();
  }

  for (unsigned i = 0; i < mzp.entry_headers.size(); i++) {
    for (unsigned j = i + 1; j < mzp.entry_headers.size(); j++) {
      // Do these ranges overlap
      auto &entry_i = mzp.entry_headers[i];
      auto &entry_j = mzp.entry_headers[j];
      const uint32_t entry_i_start = entry_i.data_offset_relative();
      const uint32_t entry_i_end = entry_i_start + entry_i.entry_data_size();
      const uint32_t entry_j_start = entry_j.data_offset_relative();
      if (entry_j_start >= entry_i_start && entry_j_start <= entry_i_end) {
        fprintf(stderr, "Entry %u begins inside of entry %u\n", j, i);
      }
    }
  }

  return 0;
}